

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O2

void h264_print_macroblock(h264_slice *slice,h264_macroblock *mb)

{
  int num;
  char *pcVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int32_t (*block) [8] [15];
  int32_t (*paaiVar5) [16] [2];
  int32_t (*paaiVar6) [16] [2];
  ulong uVar7;
  int32_t (*paaiVar8) [4] [64];
  int32_t (*block_00) [4] [64];
  int32_t (*paaiVar9) [16] [16];
  int32_t (*block_01) [16] [16];
  uint32_t (*pauVar10) [4];
  long lVar11;
  int32_t (*paaiVar12) [8] [15];
  ulong uVar13;
  int32_t (*paaiVar14) [16] [15];
  int32_t (*block_02) [16] [15];
  
  printf("\t\tmb_field_decoding_flag = %d\n",(ulong)mb->mb_field_decoding_flag);
  printf("\t\tmb_type = %d [%s]\n",(ulong)mb->mb_type,
         h264_print_macroblock_mbtypenames_rel +
         *(int *)(h264_print_macroblock_mbtypenames_rel + (ulong)mb->mb_type * 4));
  uVar2 = mb->mb_type;
  if ((uVar2 - 0x1e < 2) || (uVar2 == 0x37)) {
    for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
      printf("\t\tsub_mb_type[%d] = %d [%s]\n",uVar7 & 0xffffffff,(ulong)mb->sub_mb_type[uVar7],
             h264_print_macroblock_submbtypenames_rel +
             *(int *)(h264_print_macroblock_submbtypenames_rel + (ulong)mb->sub_mb_type[uVar7] * 4))
      ;
    }
    uVar2 = mb->mb_type;
  }
  else if (uVar2 == 0x19) {
    printf("\t\tLuma PCM:");
    h264_print_pcm(mb->pcm_sample_luma,0x100);
    uVar2 = slice->chroma_array_type - 1;
    if (2 < uVar2) {
      return;
    }
    num = *(int *)(&DAT_00111938 + (ulong)uVar2 * 4);
    printf("\t\tChroma PCM:");
    h264_print_pcm(mb->pcm_sample_chroma,num);
    return;
  }
  uVar7 = 2;
  if (uVar2 < 0x21) {
    uVar7 = (ulong)(0x1a < uVar2);
  }
  pauVar10 = mb->ref_idx;
  paaiVar5 = mb->mvd;
  for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
    printf("\t\tref_idx_l%d =",uVar13 & 0xffffffff);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      printf(" %d",(ulong)(*pauVar10)[lVar3]);
    }
    putchar(10);
    paaiVar6 = paaiVar5;
    for (uVar4 = 0; uVar4 != 2; uVar4 = uVar4 + 1) {
      printf("\t\tmvd_l%d[...][%d] =",uVar13 & 0xffffffff,uVar4 & 0xffffffff);
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        printf(" %d",(ulong)(uint)(*paaiVar6)[lVar3][0]);
      }
      putchar(10);
      paaiVar6 = (int32_t (*) [16] [2])((*paaiVar6)[0] + 1);
    }
    pauVar10 = pauVar10 + 1;
    paaiVar5 = paaiVar5 + 1;
  }
  printf("\t\ttransform_size_8x8_flag = %d\n",(ulong)mb->transform_size_8x8_flag);
  printf("\t\tcoded_block_pattern = %d\n",(ulong)mb->coded_block_pattern);
  uVar2 = mb->mb_type;
  if ((uVar2 == 0x1a) || (uVar2 == 0)) {
    if (mb->transform_size_8x8_flag == 0) {
      for (uVar7 = 0; uVar7 != 0x10; uVar7 = uVar7 + 1) {
        printf("\t\tprev_intra4x4_pred_mode_flag[%d] = %d\n",uVar7 & 0xffffffff,
               (ulong)mb->prev_intra4x4_pred_mode_flag[uVar7]);
        if (mb->prev_intra4x4_pred_mode_flag[uVar7] == 0) {
          printf("\t\trem_intra4x4_pred_mode[%d] = %d\n",uVar7 & 0xffffffff,
                 (ulong)mb->rem_intra4x4_pred_mode[uVar7]);
        }
      }
    }
    else {
      for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
        printf("\t\tprev_intra8x8_pred_mode_flag[%d] = %d\n",uVar7 & 0xffffffff,
               (ulong)mb->prev_intra8x8_pred_mode_flag[uVar7]);
        if (mb->prev_intra8x8_pred_mode_flag[uVar7] == 0) {
          printf("\t\trem_intra8x8_pred_mode[%d] = %d\n",uVar7 & 0xffffffff,
                 (ulong)mb->rem_intra8x8_pred_mode[uVar7]);
        }
      }
    }
    uVar2 = mb->mb_type;
  }
  if (uVar2 < 0x1b) {
    printf("\t\tintra_chroma_pred_mode = %d\n",(ulong)mb->intra_chroma_pred_mode);
  }
  printf("\t\tmb_qp_delta = %d\n",(ulong)(uint)mb->mb_qp_delta);
  lVar3 = (ulong)(slice->chroma_array_type == 3) * 2 + 1;
  if (mb->mb_type - 0x19 < 0xffffffe8) {
    if (mb->transform_size_8x8_flag == 0) {
      paaiVar9 = mb->block_luma_4x4;
      for (lVar11 = 0; lVar11 != lVar3; lVar11 = lVar11 + 1) {
        pcVar1 = h264_print_macroblock::aname[lVar11];
        block_01 = paaiVar9;
        for (uVar7 = 0; uVar7 != 0x10; uVar7 = uVar7 + 1) {
          printf("\t\t%s 4x4 %d:",pcVar1,uVar7 & 0xffffffff);
          h264_print_block((int32_t *)block_01,0x10);
          block_01 = (int32_t (*) [16] [16])(*block_01 + 1);
        }
        paaiVar9 = paaiVar9 + 1;
      }
    }
    else {
      paaiVar8 = mb->block_luma_8x8;
      for (lVar11 = 0; lVar11 != lVar3; lVar11 = lVar11 + 1) {
        pcVar1 = h264_print_macroblock::aname[lVar11];
        block_00 = paaiVar8;
        for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
          printf("\t\t%s 8x8 %d:",pcVar1,uVar7 & 0xffffffff);
          h264_print_block((int32_t *)block_00,0x40);
          block_00 = (int32_t (*) [4] [64])(*block_00 + 1);
        }
        paaiVar8 = paaiVar8 + 1;
      }
    }
  }
  else {
    paaiVar14 = mb->block_luma_ac;
    for (lVar11 = 0; lVar11 != lVar3; lVar11 = lVar11 + 1) {
      pcVar1 = h264_print_macroblock::aname[lVar11];
      printf("\t\t%s DC:",pcVar1);
      h264_print_block(mb->block_luma_dc[lVar11],0x10);
      block_02 = paaiVar14;
      for (uVar7 = 0; uVar7 != 0x10; uVar7 = uVar7 + 1) {
        printf("\t\t%s AC %d:",pcVar1,uVar7 & 0xffffffff);
        h264_print_block((int32_t *)block_02,0xf);
        block_02 = (int32_t (*) [16] [15])(*block_02 + 1);
      }
      paaiVar14 = paaiVar14 + 1;
    }
  }
  if (slice->chroma_array_type - 1 < 2) {
    paaiVar12 = mb->block_chroma_ac;
    lVar3 = 0;
    while (lVar3 != 2) {
      pcVar1 = h264_print_macroblock::aname[lVar3 + 1];
      printf("\t\t%s DC:",pcVar1);
      h264_print_block(mb->block_chroma_dc[lVar3],slice->chroma_array_type << 2);
      block = paaiVar12;
      for (uVar7 = 0; uVar7 < slice->chroma_array_type << 2; uVar7 = uVar7 + 1) {
        printf("\t\t%s AC %d:",pcVar1,uVar7 & 0xffffffff);
        h264_print_block((int32_t *)block,0xf);
        block = (int32_t (*) [8] [15])(*block + 1);
      }
      paaiVar12 = paaiVar12 + 1;
      lVar3 = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void h264_print_macroblock(struct h264_slice *slice, struct h264_macroblock *mb) {
	static const char *const mbtypenames[] = {
		"I_NxN",
		"I_16X16_0_0_0",
		"I_16X16_1_0_0",
		"I_16X16_2_0_0",
		"I_16X16_3_0_0",
		"I_16X16_0_1_0",
		"I_16X16_1_1_0",
		"I_16X16_2_1_0",
		"I_16X16_3_1_0",
		"I_16X16_0_2_0",
		"I_16X16_1_2_0",
		"I_16X16_2_2_0",
		"I_16X16_3_2_0",
		"I_16X16_0_0_1",
		"I_16X16_1_0_1",
		"I_16X16_2_0_1",
		"I_16X16_3_0_1",
		"I_16X16_0_1_1",
		"I_16X16_1_1_1",
		"I_16X16_2_1_1",
		"I_16X16_3_1_1",
		"I_16X16_0_2_1",
		"I_16X16_1_2_1",
		"I_16X16_2_2_1",
		"I_16X16_3_2_1",
		"I_PCM",
		"SI",
		"P_L0_16X16",
		"P_L0_L0_16X8",
		"P_L0_L0_8X16",
		"P_8X8",
		"P_8X8REF0",
		"P_SKIP",
		"B_DIRECT_16X16",
		"B_L0_16X16",
		"B_L1_16X16",
		"B_BI_16X16",
		"B_L0_L0_16X8",
		"B_L0_L0_8X16",
		"B_L1_L1_16X8",
		"B_L1_L1_8X16",
		"B_L0_L1_16X8",
		"B_L0_L1_8X16",
		"B_L1_L0_16X8",
		"B_L1_L0_8X16",
		"B_L0_BI_16X8",
		"B_L0_BI_8X16",
		"B_L1_BI_16X8",
		"B_L1_BI_8X16",
		"B_BI_L0_16X8",
		"B_BI_L0_8X16",
		"B_BI_L1_16X8",
		"B_BI_L1_8X16",
		"B_BI_BI_16X8",
		"B_BI_BI_8X16",
		"B_8X8",
		"B_SKIP",
		"UNAVAIL",
	};
	static const char *const submbtypenames[] = {
		"P_L0_8X8",
		"P_L0_8X4",
		"P_L0_4X8",
		"P_L0_4X4",
		"B_DIRECT_8X8",
		"B_L0_8X8",
		"B_L1_8X8",
		"B_BI_8X8",
		"B_L0_8X4",
		"B_L0_4X8",
		"B_L1_8X4",
		"B_L1_4X8",
		"B_BI_8X4",
		"B_BI_4X8",
		"B_L0_4X4",
		"B_L1_4X4",
		"B_BI_4X4",
	};
	static const char *const aname[3] = { "Luma", "Cb", "Cr" };
	printf("\t\tmb_field_decoding_flag = %d\n", mb->mb_field_decoding_flag);
	printf("\t\tmb_type = %d [%s]\n", mb->mb_type, mbtypenames[mb->mb_type]);
	int i, j, k;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		printf("\t\tLuma PCM:");
		h264_print_pcm(mb->pcm_sample_luma, 256);
		switch (slice->chroma_array_type) {
			case 0:
				break;
			case 1:
				printf("\t\tChroma PCM:");
				h264_print_pcm(mb->pcm_sample_chroma, 128);
				break;
			case 2:
				printf("\t\tChroma PCM:");
				h264_print_pcm(mb->pcm_sample_chroma, 256);
				break;
			case 3:
				printf("\t\tChroma PCM:");
				h264_print_pcm(mb->pcm_sample_chroma, 512);
				break;
		}
	} else {
		if (h264_is_submb_mb_type(mb->mb_type)) {
			for (i = 0; i < 4; i++) {
				printf("\t\tsub_mb_type[%d] = %d [%s]\n", i, mb->sub_mb_type[i], submbtypenames[mb->sub_mb_type[i]]);
			}
		}
		int n;
		if (mb->mb_type >= H264_MB_TYPE_B_BASE)
			n = 2;
		else if (mb->mb_type >= H264_MB_TYPE_P_BASE)
			n = 1;
		else
			n = 0;
		for (i = 0; i < n; i++) {
			printf("\t\tref_idx_l%d =", i);
			for (j = 0; j < 4; j++) {
				printf(" %d", mb->ref_idx[i][j]);
			}
			printf("\n");
			for (k = 0; k < 2; k++) {
				printf("\t\tmvd_l%d[...][%d] =", i, k);
				for (j = 0; j < 16; j++) {
					printf(" %d", mb->mvd[i][j][k]);
				}
				printf("\n");
			}
		}
		printf("\t\ttransform_size_8x8_flag = %d\n", mb->transform_size_8x8_flag);
		printf("\t\tcoded_block_pattern = %d\n", mb->coded_block_pattern);
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
			if (mb->transform_size_8x8_flag) {
				for (i = 0; i < 4; i++) {
					printf("\t\tprev_intra8x8_pred_mode_flag[%d] = %d\n", i, mb->prev_intra8x8_pred_mode_flag[i]);
					if (!mb->prev_intra8x8_pred_mode_flag[i])
						printf("\t\trem_intra8x8_pred_mode[%d] = %d\n", i, mb->rem_intra8x8_pred_mode[i]);
				}
			} else {
				for (i = 0; i < 16; i++) {
					printf("\t\tprev_intra4x4_pred_mode_flag[%d] = %d\n", i, mb->prev_intra4x4_pred_mode_flag[i]);
					if (!mb->prev_intra4x4_pred_mode_flag[i])
						printf("\t\trem_intra4x4_pred_mode[%d] = %d\n", i, mb->rem_intra4x4_pred_mode[i]);
				}
			}
		}
		if (mb->mb_type < H264_MB_TYPE_P_BASE)
			printf("\t\tintra_chroma_pred_mode = %d\n", mb->intra_chroma_pred_mode);
		printf("\t\tmb_qp_delta = %d\n", mb->mb_qp_delta);
		n = (slice->chroma_array_type == 3 ? 3 : 1);
		if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
			for (i = 0; i < n; i++) {
				printf("\t\t%s DC:", aname[i]);
				h264_print_block(mb->block_luma_dc[i], 16);
				for (j = 0; j < 16; j++) {
					printf("\t\t%s AC %d:", aname[i], j);
					h264_print_block(mb->block_luma_ac[i][j], 15);
				}
			}
		} else if (mb->transform_size_8x8_flag) {
			for (i = 0; i < n; i++) {
				for (j = 0; j < 4; j++) {
					printf("\t\t%s 8x8 %d:", aname[i], j);
					h264_print_block(mb->block_luma_8x8[i][j], 64);
				}
			}
		} else {
			for (i = 0; i < n; i++) {
				for (j = 0; j < 16; j++) {
					printf("\t\t%s 4x4 %d:", aname[i], j);
					h264_print_block(mb->block_luma_4x4[i][j], 16);
				}
			}
		}
		if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
			for (i = 0; i < 2; i++) {
				printf("\t\t%s DC:", aname[i+1]);
				h264_print_block(mb->block_chroma_dc[i], slice->chroma_array_type * 4);
				for (j = 0; j < slice->chroma_array_type * 4; j++) {
					printf("\t\t%s AC %d:", aname[i+1], j);
					h264_print_block(mb->block_chroma_ac[i][j], 15);
				}
			}
		}
	}
}